

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShortcutsWindow.cpp
# Opt level: O2

size_t __thiscall cursespp::ShortcutsWindow::CalculateLeftPadding(ShortcutsWindow *this)

{
  pointer psVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  value_type e;
  __shared_ptr<cursespp::ShortcutsWindow::Entry,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  if (this->alignment == AlignLeft) {
    sVar3 = 0;
  }
  else {
    uVar2 = (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x19])();
    lVar5 = 0;
    for (uVar6 = 0;
        psVar1 = (this->entries).
                 super__Vector_base<std::shared_ptr<cursespp::ShortcutsWindow::Entry>,_std::allocator<std::shared_ptr<cursespp::ShortcutsWindow::Entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar6 < (ulong)((long)(this->entries).
                              super__Vector_base<std::shared_ptr<cursespp::ShortcutsWindow::Entry>,_std::allocator<std::shared_ptr<cursespp::ShortcutsWindow::Entry>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4);
        uVar6 = uVar6 + 1) {
      std::__shared_ptr<cursespp::ShortcutsWindow::Entry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,
                 (__shared_ptr<cursespp::ShortcutsWindow::Entry,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(psVar1->
                         super___shared_ptr<cursespp::ShortcutsWindow::Entry,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr + lVar5));
      sVar3 = f8n::utf::u8cols(&(local_40._M_ptr)->key);
      sVar4 = f8n::utf::u8cols(&(local_40._M_ptr)->description);
      uVar2 = (uVar2 - ((int)sVar4 + (int)sVar3)) - 5;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      lVar5 = lVar5 + 0x10;
    }
    sVar3 = 0;
    if (-1 < (int)uVar2) {
      sVar3 = (size_t)(uVar2 >> (this->alignment != AlignRight));
    }
  }
  return sVar3;
}

Assistant:

size_t ShortcutsWindow::CalculateLeftPadding() {
    if (this->alignment == text::AlignLeft) {
        return 0;
    }

    int padding = this->GetContentWidth();

    for (size_t i = 0; i < this->entries.size(); i++) {
        auto e = this->entries[i];
        padding -= u8cols(e->key) + u8cols(e->description) + 5;
    }

    if (padding < 0) {
        return 0;
    }

    if (this->alignment == text::AlignRight) {
        return padding;
    }

    return (padding / 2); /* text::AlignCenter */
}